

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O0

void ScaleRowDown34_1_Box_C(uint8_t *src_ptr,ptrdiff_t src_stride,uint8_t *d,int dst_width)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  uint8_t b2;
  uint8_t b1;
  uint8_t b0;
  uint8_t a2;
  uint8_t a1;
  uint8_t a0;
  int x;
  uint8_t *t;
  uint8_t *s;
  int dst_width_local;
  uint8_t *d_local;
  ptrdiff_t src_stride_local;
  uint8_t *src_ptr_local;
  
  t = src_ptr + src_stride;
  s = src_ptr;
  d_local = d;
  for (x = 0; x < dst_width; x = x + 3) {
    bVar1 = s[1];
    bVar2 = s[2];
    bVar3 = s[2];
    bVar4 = s[3];
    bVar5 = t[1];
    bVar6 = t[2];
    bVar7 = t[2];
    bVar8 = t[3];
    *d_local = (uint8_t)((int)(((int)((uint)*s * 3 + (uint)s[1] + 2) >> 2 & 0xffU) +
                               ((int)((uint)*t * 3 + (uint)t[1] + 2) >> 2 & 0xffU) + 1) >> 1);
    d_local[1] = (uint8_t)((int)(((int)((uint)bVar1 + (uint)bVar2 + 1) >> 1 & 0xffU) +
                                 ((int)((uint)bVar5 + (uint)bVar6 + 1) >> 1 & 0xffU) + 1) >> 1);
    d_local[2] = (uint8_t)((int)(((int)((uint)bVar3 + (uint)bVar4 * 3 + 2) >> 2 & 0xffU) +
                                 ((int)((uint)bVar7 + (uint)bVar8 * 3 + 2) >> 2 & 0xffU) + 1) >> 1);
    d_local = d_local + 3;
    s = s + 4;
    t = t + 4;
  }
  return;
}

Assistant:

void ScaleRowDown34_1_Box_C(const uint8_t* src_ptr,
                            ptrdiff_t src_stride,
                            uint8_t* d,
                            int dst_width) {
  const uint8_t* s = src_ptr;
  const uint8_t* t = src_ptr + src_stride;
  int x;
  assert((dst_width % 3 == 0) && (dst_width > 0));
  for (x = 0; x < dst_width; x += 3) {
    uint8_t a0 = (s[0] * 3 + s[1] * 1 + 2) >> 2;
    uint8_t a1 = (s[1] * 1 + s[2] * 1 + 1) >> 1;
    uint8_t a2 = (s[2] * 1 + s[3] * 3 + 2) >> 2;
    uint8_t b0 = (t[0] * 3 + t[1] * 1 + 2) >> 2;
    uint8_t b1 = (t[1] * 1 + t[2] * 1 + 1) >> 1;
    uint8_t b2 = (t[2] * 1 + t[3] * 3 + 2) >> 2;
    d[0] = (a0 + b0 + 1) >> 1;
    d[1] = (a1 + b1 + 1) >> 1;
    d[2] = (a2 + b2 + 1) >> 1;
    d += 3;
    s += 4;
    t += 4;
  }
}